

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  ImVector<ImDrawList_*> *out_render_list;
  int *piVar1;
  ImDrawList *this;
  ImVec2 *uv0;
  ImVec2 *uv1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  uint uVar4;
  ImGuiWindow *window;
  ImTextureID user_texture_id;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar5;
  void *__dest;
  ulong uVar6;
  ImDrawList **__dest_00;
  ImGuiContext *pIVar7;
  char *__function;
  int iVar8;
  void *pvVar9;
  ImVector<ImDrawList_*> *out_render_list_00;
  ImDrawList **ppIVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ImVec2 pos;
  ImTextureID tex_id;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  undefined8 uStack_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 *local_68;
  ImVec2 *local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImTextureID local_38;
  
  pIVar5 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0xa6e,"void ImGui::Render()");
  }
  iVar11 = GImGui->FrameCountEnded;
  if (iVar11 != GImGui->FrameCount) {
    EndFrame();
    iVar11 = pIVar5->FrameCount;
  }
  pIVar5->FrameCountRendered = iVar11;
  if ((pIVar5->Style).Alpha <= 0.0) {
    return;
  }
  (pIVar5->IO).MetricsActiveWindows = 0;
  (pIVar5->IO).MetricsRenderVertices = 0;
  (pIVar5->IO).MetricsRenderIndices = 0;
  out_render_list = pIVar5->RenderDrawLists;
  lVar12 = 0;
  do {
    pIVar7 = GImGui;
    if (*(int *)((long)&pIVar5->RenderDrawLists[0].Capacity + lVar12) < 0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (*(pIVar7->IO).MemAllocFn)(0);
      pvVar9 = *(void **)((long)&pIVar5->RenderDrawLists[0].Data + lVar12);
      if (pvVar9 == (void *)0x0) {
LAB_00133959:
        pvVar9 = (void *)0x0;
        pIVar7 = GImGui;
      }
      else {
        memcpy(__dest,pvVar9,(long)*(int *)((long)&pIVar5->RenderDrawLists[0].Size + lVar12) << 3);
        pIVar7 = GImGui;
        pvVar9 = *(void **)((long)&pIVar5->RenderDrawLists[0].Data + lVar12);
        if (pvVar9 == (void *)0x0) goto LAB_00133959;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(pIVar7->IO).MemFreeFn)(pvVar9);
      *(void **)((long)&pIVar5->RenderDrawLists[0].Data + lVar12) = __dest;
      *(undefined4 *)((long)&pIVar5->RenderDrawLists[0].Capacity + lVar12) = 0;
    }
    *(undefined4 *)((long)&pIVar5->RenderDrawLists[0].Size + lVar12) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x30);
  uVar4 = (pIVar5->Windows).Size;
  uVar6 = (ulong)uVar4;
  if (uVar4 != 0) {
    uVar14 = 0;
    do {
      if ((long)(int)uVar6 <= (long)uVar14) {
        __function = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00133d97;
      }
      window = (pIVar5->Windows).Data[uVar14];
      if (((window->Active == true) && (window->HiddenFrames < 1)) &&
         (uVar4 = window->Flags, (uVar4 >> 0x14 & 1) == 0)) {
        piVar1 = &(pIVar5->IO).MetricsActiveWindows;
        *piVar1 = *piVar1 + 1;
        out_render_list_00 = out_render_list;
        if ((uVar4 >> 0x18 & 1) != 0) {
          out_render_list_00 = pIVar5->RenderDrawLists + 2;
        }
        if ((uVar4 >> 0x19 & 1) != 0) {
          out_render_list_00 = pIVar5->RenderDrawLists + 1;
        }
        AddWindowToRenderList(out_render_list_00,window);
      }
      uVar14 = uVar14 + 1;
      uVar6 = (ulong)(uint)(pIVar5->Windows).Size;
    } while (uVar14 != uVar6);
  }
  pIVar7 = GImGui;
  iVar11 = pIVar5->RenderDrawLists[0].Size;
  iVar13 = pIVar5->RenderDrawLists[0].Capacity;
  iVar8 = pIVar5->RenderDrawLists[1].Size + iVar11 + pIVar5->RenderDrawLists[2].Size;
  if (iVar8 <= iVar13) goto LAB_00133ac3;
  if (iVar13 == 0) {
    iVar13 = 8;
  }
  else {
    iVar13 = iVar13 / 2 + iVar13;
  }
  if (iVar13 <= iVar8) {
    iVar13 = iVar8;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest_00 = (ImDrawList **)(*(pIVar7->IO).MemAllocFn)((long)iVar13 << 3);
  ppIVar10 = pIVar5->RenderDrawLists[0].Data;
  if (ppIVar10 == (ImDrawList **)0x0) {
LAB_00133aad:
    ppIVar10 = (ImDrawList **)0x0;
    pIVar7 = GImGui;
  }
  else {
    memcpy(__dest_00,ppIVar10,(long)pIVar5->RenderDrawLists[0].Size << 3);
    pIVar7 = GImGui;
    ppIVar10 = pIVar5->RenderDrawLists[0].Data;
    if (ppIVar10 == (ImDrawList **)0x0) goto LAB_00133aad;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar7->IO).MemFreeFn)(ppIVar10);
  pIVar5->RenderDrawLists[0].Data = __dest_00;
  pIVar5->RenderDrawLists[0].Capacity = iVar13;
LAB_00133ac3:
  pIVar5->RenderDrawLists[0].Size = iVar8;
  lVar12 = 0;
  do {
    uVar4 = *(uint *)((long)&pIVar5->RenderDrawLists[1].Size + lVar12);
    if ((ulong)uVar4 != 0) {
      if ((out_render_list->Size <= iVar11) || ((int)uVar4 < 1)) {
        __function = "value_type &ImVector<ImDrawList *>::operator[](int) [T = ImDrawList *]";
LAB_00133d97:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,__function);
      }
      memcpy(pIVar5->RenderDrawLists[0].Data + iVar11,
             *(void **)((long)&pIVar5->RenderDrawLists[1].Data + lVar12),(ulong)uVar4 << 3);
      iVar11 = iVar11 + *(int *)((long)&pIVar5->RenderDrawLists[1].Size + lVar12);
    }
    lVar12 = lVar12 + 0x10;
    if (lVar12 == 0x20) {
      if ((pIVar5->IO).MouseDrawCursor != false) {
        iVar11 = pIVar5->MouseCursor;
        IVar2 = (pIVar5->IO).MousePos;
        local_60 = pIVar5->MouseCursorData[iVar11].TexUvMin;
        IVar3 = pIVar5->MouseCursorData[iVar11].HotOffset;
        local_88.x = IVar2.x - IVar3.x;
        local_88.y = IVar2.y - IVar3.y;
        uStack_80 = 0;
        local_90.y = local_88.y;
        local_90.x = local_88.x;
        user_texture_id = ((pIVar5->IO).Fonts)->TexID;
        this = &pIVar5->OverlayDrawList;
        local_58.y = local_88.y + 0.0;
        local_58.x = local_88.x + 1.0;
        uStack_50 = 0;
        local_78 = pIVar5->MouseCursorData[iVar11].Size;
        uStack_70 = 0;
        local_38 = user_texture_id;
        ImDrawList::PushTextureID(this,&local_38);
        local_a0 = local_58;
        local_48 = local_78.x + local_58.x;
        fStack_44 = local_78.y + local_58.y;
        fStack_40 = (float)uStack_70 + (float)uStack_50;
        fStack_3c = uStack_70._4_4_ + uStack_50._4_4_;
        local_98.y = fStack_44;
        local_98.x = local_48;
        uv0 = pIVar5->MouseCursorData[iVar11].TexUvMin + 1;
        local_68 = pIVar5->MouseCursorData[iVar11].TexUvMax;
        uv1 = pIVar5->MouseCursorData[iVar11].TexUvMax + 1;
        ImDrawList::AddImage(this,user_texture_id,&local_a0,&local_98,uv0,uv1,0x30000000);
        local_a0.y = local_58.y;
        local_a0.x = local_88.x + 2.0;
        local_98.y = fStack_44;
        local_98.x = local_88.x + 2.0 + local_78.x;
        ImDrawList::AddImage(this,user_texture_id,&local_a0,&local_98,uv0,uv1,0x30000000);
        local_88.x = local_88.x + local_78.x;
        local_88.y = local_88.y + local_78.y;
        uStack_80 = CONCAT44(uStack_80._4_4_ + uStack_70._4_4_,(float)uStack_80 + (float)uStack_70);
        local_a0.y = local_88.y;
        local_a0.x = local_88.x;
        ImDrawList::AddImage(this,user_texture_id,&local_90,&local_a0,uv0,uv1,0xff000000);
        local_a0 = local_88;
        ImDrawList::AddImage(this,user_texture_id,&local_90,&local_a0,local_60,local_68,0xffffffff);
        ImDrawList::PopTextureID(this);
      }
      if ((pIVar5->OverlayDrawList).VtxBuffer.Size != 0) {
        AddDrawListToRenderList(out_render_list,&pIVar5->OverlayDrawList);
      }
      (pIVar5->RenderDrawData).Valid = true;
      iVar11 = pIVar5->RenderDrawLists[0].Size;
      if (iVar11 < 1) {
        (pIVar5->RenderDrawData).CmdLists = (ImDrawList **)0x0;
        (pIVar5->RenderDrawData).CmdListsCount = iVar11;
        iVar11 = (pIVar5->IO).MetricsRenderIndices;
        (pIVar5->RenderDrawData).TotalVtxCount = (pIVar5->IO).MetricsRenderVertices;
        (pIVar5->RenderDrawData).TotalIdxCount = iVar11;
      }
      else {
        (pIVar5->RenderDrawData).CmdLists = pIVar5->RenderDrawLists[0].Data;
        (pIVar5->RenderDrawData).CmdListsCount = iVar11;
        iVar11 = (pIVar5->IO).MetricsRenderIndices;
        (pIVar5->RenderDrawData).TotalVtxCount = (pIVar5->IO).MetricsRenderVertices;
        (pIVar5->RenderDrawData).TotalIdxCount = iVar11;
        UNRECOVERED_JUMPTABLE = (pIVar5->IO).RenderDrawListsFn;
        if (UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0) {
          (*UNRECOVERED_JUMPTABLE)(&pIVar5->RenderDrawData);
          return;
        }
      }
      return;
    }
  } while( true );
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Skip render altogether if alpha is 0.0
    // Note that vertex buffers have been created and are wasted, so it is best practice that you don't create windows in the first place, or consistently respond to Begin() returning false.
    if (g.Style.Alpha > 0.0f)
    {
        // Gather windows to render
        g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
        for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            g.RenderDrawLists[i].resize(0);
        for (int i = 0; i != g.Windows.Size; i++)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window->Active && window->HiddenFrames <= 0 && (window->Flags & (ImGuiWindowFlags_ChildWindow)) == 0)
            {
                // FIXME: Generalize this with a proper layering system so e.g. user can draw in specific layers, below text, ..
                g.IO.MetricsActiveWindows++;
                if (window->Flags & ImGuiWindowFlags_Popup)
                    AddWindowToRenderList(g.RenderDrawLists[1], window);
                else if (window->Flags & ImGuiWindowFlags_Tooltip)
                    AddWindowToRenderList(g.RenderDrawLists[2], window);
                else
                    AddWindowToRenderList(g.RenderDrawLists[0], window);
            }
        }

        // Flatten layers
        int n = g.RenderDrawLists[0].Size;
        int flattened_size = n;
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            flattened_size += g.RenderDrawLists[i].Size;
        g.RenderDrawLists[0].resize(flattened_size);
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        {
            ImVector<ImDrawList*>& layer = g.RenderDrawLists[i];
            if (layer.empty())
                continue;
            memcpy(&g.RenderDrawLists[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
            n += layer.Size;
        }

        // Draw software mouse cursor if requested
        if (g.IO.MouseDrawCursor)
        {
            const ImGuiMouseCursorData& cursor_data = g.MouseCursorData[g.MouseCursor];
            const ImVec2 pos = g.IO.MousePos - cursor_data.HotOffset;
            const ImVec2 size = cursor_data.Size;
            const ImTextureID tex_id = g.IO.Fonts->TexID;
            g.OverlayDrawList.PushTextureID(tex_id);
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(1,0), pos+ImVec2(1,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(2,0), pos+ImVec2(2,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,255));       // Black border
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[0], cursor_data.TexUvMax[0], IM_COL32(255,255,255,255)); // White fill
            g.OverlayDrawList.PopTextureID();
        }
        if (!g.OverlayDrawList.VtxBuffer.empty())
            AddDrawListToRenderList(g.RenderDrawLists[0], &g.OverlayDrawList);

        // Setup draw data
        g.RenderDrawData.Valid = true;
        g.RenderDrawData.CmdLists = (g.RenderDrawLists[0].Size > 0) ? &g.RenderDrawLists[0][0] : NULL;
        g.RenderDrawData.CmdListsCount = g.RenderDrawLists[0].Size;
        g.RenderDrawData.TotalVtxCount = g.IO.MetricsRenderVertices;
        g.RenderDrawData.TotalIdxCount = g.IO.MetricsRenderIndices;

        // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
        if (g.RenderDrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
            g.IO.RenderDrawListsFn(&g.RenderDrawData);
    }
}